

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O1

uint64_t __thiscall FIX::UInt64Field::getValue(UInt64Field *this)

{
  unsigned_long uVar1;
  
  uVar1 = IntTConvertor<unsigned_long>::convert(&(this->super_FieldBase).m_string);
  return uVar1;
}

Assistant:

EXCEPT(IncorrectDataFormat) {
    try {
      return UInt64Convertor::convert(getString());
    } catch (FieldConvertError &) {
      throw IncorrectDataFormat(getTag(), getString());
    }
  }